

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O1

int intglobal(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  addressrec aVar4;
  symboltype sVar5;
  uint uVar6;
  addressrec *paVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  bool bVar15;
  
  if (0 < numcodes) {
    piVar13 = &intcode[1].op3.opnd;
    lVar14 = 0;
    do {
      if (intcode[lVar14].opcode == opassn) {
        sVar5 = symclass(intcode[lVar14].op1.opnd);
        if (sVar5 == sttempvar) {
          if (lVar14 + 1 < (long)numcodes) {
            uVar6 = numcodes - 1;
            cVar8 = '\0';
            lVar12 = lVar14;
            piVar11 = piVar13;
            do {
              if ((7 < (uint)piVar11[-6]) || (cVar8 != '\0')) {
                uVar6 = (uint)lVar12;
                break;
              }
              iVar10 = intcode[lVar14].op1.opnd;
              cVar8 = '\x01';
              if (iVar10 != piVar11[-2]) {
                cVar8 = (iVar10 == *piVar11) * '\x02';
              }
              lVar12 = lVar12 + 1;
              piVar11 = piVar11 + 7;
            } while ((ulong)(uint)numcodes - 1 != lVar12);
          }
          else {
            cVar8 = '\0';
            uVar6 = (uint)lVar14;
          }
          if (cVar8 == '\x02') {
            paVar7 = &intcode[uVar6].op3;
          }
          else {
            if (cVar8 != '\x01') goto LAB_0010851e;
            paVar7 = &intcode[uVar6].op2;
          }
          *paVar7 = intcode[lVar14].op2;
          intcode[lVar14].opcode = opnull;
        }
      }
LAB_0010851e:
      lVar14 = lVar14 + 1;
      piVar13 = piVar13 + 7;
    } while (lVar14 < numcodes);
  }
  if (0 < numcodes) {
    piVar13 = &intcode[1].op3.opnd;
    iVar10 = 2;
    lVar14 = 0;
    do {
      if (intcode[lVar14].opcode == opassn) {
        sVar5 = symclass(intcode[lVar14].op1.opnd);
        if (sVar5 == sttempvar) {
          if (lVar14 + 1 < (long)numcodes) {
            iVar1 = intcode[lVar14].op1.opnd;
            piVar11 = piVar13;
            iVar9 = iVar10;
            do {
              if ((piVar11[-4] == iVar1) || (piVar11[-2] == iVar1)) {
                bVar15 = false;
              }
              else {
                bVar15 = *piVar11 != iVar1;
              }
              if (numcodes <= iVar9) break;
              piVar11 = piVar11 + 7;
              iVar9 = iVar9 + 1;
            } while (bVar15);
            if (!bVar15) goto LAB_001085c1;
          }
          intcode[lVar14].opcode = opnull;
        }
      }
LAB_001085c1:
      lVar14 = lVar14 + 1;
      piVar13 = piVar13 + 7;
      iVar10 = iVar10 + 1;
    } while (lVar14 < numcodes);
  }
  if (numcodes < 1) {
    iVar10 = 0;
  }
  else {
    lVar14 = 0;
    iVar10 = 0;
    do {
      if (*(int *)((long)&intcode[0].opcode + lVar14) != 0) {
        uVar2 = *(undefined8 *)((long)&intcode[0].opcode + lVar14);
        uVar3 = *(undefined8 *)((long)&intcode[0].op1.opnd + lVar14);
        aVar4 = *(addressrec *)((long)&intcode[0].op3.opndtype + lVar14);
        intcode[iVar10].op2 = *(addressrec *)((long)&intcode[0].op2.opndtype + lVar14);
        intcode[iVar10].op3 = aVar4;
        intcode[iVar10].opcode = (int)uVar2;
        intcode[iVar10].op1.opndtype = (int)((ulong)uVar2 >> 0x20);
        *(undefined8 *)&intcode[iVar10].op1.opnd = uVar3;
        iVar10 = iVar10 + 1;
      }
      lVar14 = lVar14 + 0x1c;
    } while ((ulong)(uint)numcodes * 0x1c != lVar14);
  }
  numcodes = iVar10;
  return iVar10;
}

Assistant:

int	intglobal(void)
{
    int	i, j, tempused, tempcopied;
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempcopied = 0;
            for (j = i + 1;  j < numcodes && insamebb(j)
                 && !tempcopied;  j++)
                tempcopied = copyprop(i, j);
            if (tempcopied == 1)	{
                intcode[j-1].op2 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
            else if (tempcopied == 2)	{
                intcode[j-1].op3 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
        }
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempused = 0;
            for (j = i + 1;  j < numcodes && !tempused;  j++)
                tempused = codeappears(i, j);
            if (!tempused)
                intcode[i].opcode = opnull;
        }
    packcode();
    
    return(numcodes);
}